

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::WriteToShardStatusFileIfNeeded(void)

{
  char *__filename;
  FILE *__stream;
  
  __filename = getenv("GTEST_SHARD_STATUS_FILE");
  if (__filename == (char *)0x0) {
    return;
  }
  __stream = fopen(__filename,"w");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    return;
  }
  ColoredPrintf(COLOR_RED,
                "Could not write to the test shard status file \"%s\" specified by the %s environment variable.\n"
                ,__filename,"GTEST_SHARD_STATUS_FILE");
  fflush(_stdout);
  exit(1);
}

Assistant:

int String::Compare(const String & rhs) const {
  const char* const lhs_c_str = c_str();
  const char* const rhs_c_str = rhs.c_str();

  if (lhs_c_str == NULL) {
    return rhs_c_str == NULL ? 0 : -1;  // NULL < anything except NULL
  } else if (rhs_c_str == NULL) {
    return 1;
  }

  const size_t shorter_str_len =
      length() <= rhs.length() ? length() : rhs.length();
  for (size_t i = 0; i != shorter_str_len; i++) {
    if (lhs_c_str[i] < rhs_c_str[i]) {
      return -1;
    } else if (lhs_c_str[i] > rhs_c_str[i]) {
      return 1;
    }
  }
  return (length() < rhs.length()) ? -1 :
      (length() > rhs.length()) ? 1 : 0;
}